

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O0

bool Diligent::PSOSerializer<(Diligent::SerializerMode)1>::SerializeCreateInfo
               (Serializer<(Diligent::SerializerMode)1> *Ser,
               ConstQual<PipelineStateCreateInfo> *CreateInfo,ConstQual<TPRSNames> *PRSNames,
               DynamicLinearAllocator *Allocator)

{
  uint uVar1;
  ConstQual<PipelineStateCreateInfo> *this;
  bool bVar2;
  uint *puVar3;
  const_reference Arg0;
  uint local_44;
  uint local_40;
  Uint32 i;
  PipelineResourceLayoutDesc *ResourceLayout;
  DynamicLinearAllocator *Allocator_local;
  ConstQual<TPRSNames> *PRSNames_local;
  ConstQual<PipelineStateCreateInfo> *CreateInfo_local;
  Serializer<(Diligent::SerializerMode)1> *Ser_local;
  
  ResourceLayout = (PipelineResourceLayoutDesc *)Allocator;
  Allocator_local = (DynamicLinearAllocator *)PRSNames;
  PRSNames_local = (ConstQual<TPRSNames> *)CreateInfo;
  CreateInfo_local = (ConstQual<PipelineStateCreateInfo> *)Ser;
  bVar2 = Serializer<(Diligent::SerializerMode)1>::operator()
                    (Ser,&(CreateInfo->PSODesc).PipelineType);
  if (bVar2) {
    bVar2 = Serializer<(Diligent::SerializerMode)1>::operator()
                      ((Serializer<(Diligent::SerializerMode)1> *)CreateInfo_local,
                       (uint *)((long)PRSNames_local[1]._M_elems + 4),
                       (PSO_CREATE_FLAGS *)(PRSNames_local + 1));
    if (bVar2) {
      _i = PRSNames_local->_M_elems + 3;
      bVar2 = Serializer<(Diligent::SerializerMode)1>::operator()
                        ((Serializer<(Diligent::SerializerMode)1> *)CreateInfo_local,
                         (SHADER_RESOURCE_VARIABLE_TYPE *)_i,
                         (SHADER_TYPE *)((long)PRSNames_local->_M_elems + 0x1c));
      if (bVar2) {
        bVar2 = Serializer<(Diligent::SerializerMode)1>::
                SerializeArray<Diligent::ShaderResourceVariableDesc_const*const,unsigned_int_const,Diligent::PSOSerializer<(Diligent::SerializerMode)1>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::PipelineStateCreateInfo_const&,std::array<char_const*,8ul>const&,Diligent::DynamicLinearAllocator*)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::ShaderResourceVariableDesc_const&)_1_>
                          ((Serializer<(Diligent::SerializerMode)1> *)CreateInfo_local,
                           ResourceLayout,_i + 2,_i + 1);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          bVar2 = Serializer<(Diligent::SerializerMode)1>::
                  SerializeArray<Diligent::ImmutableSamplerDesc_const*const,unsigned_int_const,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::ImmutableSamplerDesc_const&)>
                            ((Serializer<(Diligent::SerializerMode)1> *)CreateInfo_local,
                             (DynamicLinearAllocator *)ResourceLayout,
                             (ImmutableSamplerDesc **)(_i + 4),(uint *)(_i + 3),
                             SerializeImmutableSampler<(Diligent::SerializerMode)1>);
          if (bVar2) {
            local_40 = 0;
            while( true ) {
              uVar1 = local_40;
              local_44 = 1;
              puVar3 = std::max<unsigned_int>
                                 ((uint *)((long)PRSNames_local[1]._M_elems + 4),&local_44);
              this = CreateInfo_local;
              if (*puVar3 <= uVar1) break;
              Arg0 = std::array<const_char_*,_8UL>::operator[]
                               ((array<const_char_*,_8UL> *)Allocator_local,(ulong)local_40);
              bVar2 = Serializer<(Diligent::SerializerMode)1>::operator()
                                ((Serializer<(Diligent::SerializerMode)1> *)this,Arg0);
              if (!bVar2) {
                return false;
              }
              local_40 = local_40 + 1;
            }
            Ser_local._7_1_ = true;
          }
          else {
            Ser_local._7_1_ = false;
          }
        }
        else {
          Ser_local._7_1_ = false;
        }
      }
      else {
        Ser_local._7_1_ = false;
      }
    }
    else {
      Ser_local._7_1_ = false;
    }
  }
  else {
    Ser_local._7_1_ = false;
  }
  return Ser_local._7_1_;
}

Assistant:

bool PSOSerializer<Mode>::SerializeCreateInfo(
    Serializer<Mode>&                   Ser,
    ConstQual<PipelineStateCreateInfo>& CreateInfo,
    ConstQual<TPRSNames>&               PRSNames,
    DynamicLinearAllocator*             Allocator)
{
    // Serialize PipelineStateCreateInfo
    // Serialize PipelineStateDesc
    if (!Ser(CreateInfo.PSODesc.PipelineType))
        return false;

    if (!Ser(CreateInfo.ResourceSignaturesCount,
             CreateInfo.Flags))
        return false;
    // skip SRBAllocationGranularity
    // skip ImmediateContextMask
    // skip pPSOCache

    auto& ResourceLayout = CreateInfo.PSODesc.ResourceLayout;
    if (!Ser(ResourceLayout.DefaultVariableType, ResourceLayout.DefaultVariableMergeStages))
        return false;

    if (!Ser.SerializeArray(Allocator, ResourceLayout.Variables, ResourceLayout.NumVariables,
                            [](Serializer<Mode>&                      Ser,
                               ConstQual<ShaderResourceVariableDesc>& VarDesc) //
                            {
                                return Ser(VarDesc.Name,
                                           VarDesc.ShaderStages,
                                           VarDesc.Type,
                                           VarDesc.Flags);
                            }))
        return false;

    if (!Ser.SerializeArray(Allocator, ResourceLayout.ImmutableSamplers, ResourceLayout.NumImmutableSamplers, SerializeImmutableSampler<Mode>))
        return false;

    // Instead of ppResourceSignatures
    for (Uint32 i = 0; i < std::max(CreateInfo.ResourceSignaturesCount, 1u); ++i)
    {
        if (!Ser(PRSNames[i]))
            return false;
    }

    ASSERT_SIZEOF64(ShaderResourceVariableDesc, 16, "Did you add a new member to ShaderResourceVariableDesc? Please add serialization here.");
    ASSERT_SIZEOF64(PipelineStateCreateInfo, 96, "Did you add a new member to PipelineStateCreateInfo? Please add serialization here.");

    return true;
}